

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_thread_info_init(tsdn_t *tsdn,background_thread_info_t *info)

{
  tsd_t *ptVar1;
  
  (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.binshard[0xb] = '\0';
  duckdb_je_nstime_init
            ((nstime_t *)
             ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.binshard +
             0xf),0);
  ptVar1 = &tsdn->tsd;
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x17] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x18] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x19] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1a] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1b] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1c] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1d] = '\0';
  (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[0x1e] = '\0';
  *(undefined8 *)
   ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.binshard + 0x1f) = 0
  ;
  duckdb_je_nstime_copy
            ((nstime_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link
             ,&nstime_zero);
  return;
}

Assistant:

static void
background_thread_info_init(tsdn_t *tsdn, background_thread_info_t *info) {
	background_thread_wakeup_time_set(tsdn, info, 0);
	info->npages_to_purge_new = 0;
	if (config_stats) {
		info->tot_n_runs = 0;
		nstime_init_zero(&info->tot_sleep_time);
	}
}